

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall leveldb::CorruptionTest::Build(CorruptionTest *this,int n)

{
  Slice SVar1;
  Status local_258;
  Tester local_250;
  WriteOptions local_a9;
  undefined1 auStack_a8 [7];
  WriteOptions options;
  undefined1 local_98 [8];
  Slice key;
  int i;
  undefined1 local_78 [8];
  WriteBatch batch;
  string value_space;
  string local_38 [8];
  string key_space;
  int n_local;
  CorruptionTest *this_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string((string *)&batch.field_0x18);
  WriteBatch::WriteBatch((WriteBatch *)local_78);
  for (key.size_._0_4_ = 0; (int)key.size_ < n; key.size_._0_4_ = (int)key.size_ + 1) {
    SVar1 = Key(this,(int)key.size_,(string *)local_38);
    key.data_ = (char *)SVar1.size_;
    local_98 = (undefined1  [8])SVar1.data_;
    WriteBatch::Clear((WriteBatch *)local_78);
    SVar1 = Value(this,(int)key.size_,(string *)&batch.field_0x18);
    _auStack_a8 = SVar1.data_;
    WriteBatch::Put((WriteBatch *)local_78,(Slice *)local_98,(Slice *)auStack_a8);
    WriteOptions::WriteOptions(&local_a9);
    if ((int)key.size_ == n + -1) {
      local_a9.sync = true;
    }
    test::Tester::Tester
              (&local_250,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
               ,0x47);
    (*this->db_->_vptr_DB[4])(&local_258,this->db_,&local_a9,local_78);
    test::Tester::IsOk(&local_250,&local_258);
    Status::~Status(&local_258);
    test::Tester::~Tester(&local_250);
  }
  WriteBatch::~WriteBatch((WriteBatch *)local_78);
  std::__cxx11::string::~string((string *)&batch.field_0x18);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Build(int n) {
    std::string key_space, value_space;
    WriteBatch batch;
    for (int i = 0; i < n; i++) {
      // if ((i % 100) == 0) fprintf(stderr, "@ %d of %d\n", i, n);
      Slice key = Key(i, &key_space);
      batch.Clear();
      batch.Put(key, Value(i, &value_space));
      WriteOptions options;
      // Corrupt() doesn't work without this sync on windows; stat reports 0 for
      // the file size.
      if (i == n - 1) {
        options.sync = true;
      }
      ASSERT_OK(db_->Write(options, &batch));
    }
  }